

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ScanfFunc::checkArguments
          (ScanfFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *diag;
  Expression *pEVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,0x7fffffff);
  if (!bVar2) goto LAB_00352d9b;
  pTVar3 = ((*args->_M_ptr)->type).ptr;
  if (this->isFscanf == true) {
    bVar2 = Type::isIntegral(pTVar3);
    if (!bVar2) {
      pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
      return pTVar3;
    }
LAB_00352d2b:
    bVar2 = Type::canBeStringLike((args->_M_ptr[1]->type).ptr);
    if (bVar2) {
      return pCVar1->integerType;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,args->_M_ptr[1]->sourceRange);
    pEVar4 = args->_M_ptr[1];
  }
  else {
    bVar2 = Type::canBeStringLike(pTVar3);
    if (bVar2) goto LAB_00352d2b;
    diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,(*args->_M_ptr)->sourceRange);
    pEVar4 = *args->_M_ptr;
  }
  ast::operator<<(diag,(pEVar4->type).ptr);
LAB_00352d9b:
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        // First argument is an fd or a string.
        if (isFscanf) {
            if (!args[0]->type->isIntegral())
                return badArg(context, *args[0]);
        }
        else {
            if (!args[0]->type->canBeStringLike()) {
                context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << *args[0]->type;
                return comp.getErrorType();
            }
        }

        // Second arg is a format string.
        if (!args[1]->type->canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[1]->sourceRange) << *args[1]->type;
            return comp.getErrorType();
        }

        // TODO: add some compile-time checking of the format string here
        return comp.getIntegerType();
    }